

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall duckdb::AllocatedData::Reset(AllocatedData *this)

{
  Allocator *pAVar1;
  
  if (this->pointer != (data_ptr_t)0x0) {
    optional_ptr<duckdb::Allocator,_true>::CheckValid(&this->allocator);
    if (this->pointer != (data_ptr_t)0x0) {
      pAVar1 = (this->allocator).ptr;
      (*pAVar1->free_function)
                ((PrivateAllocatorData *)
                 (pAVar1->private_data).
                 super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                 .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>,this->pointer,
                 this->allocated_size);
    }
    this->pointer = (data_ptr_t)0x0;
    this->allocated_size = 0;
  }
  return;
}

Assistant:

void AllocatedData::Reset() {
	if (!pointer) {
		return;
	}
	D_ASSERT(allocator);
	allocator->FreeData(pointer, allocated_size);
	allocated_size = 0;
	pointer = nullptr;
}